

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::StartList(ProtoWriter *this,StringPiece name)

{
  string *psVar1;
  ProtoElement *pPVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  Field *field;
  Type *type;
  LocationTrackerInterface *pLVar5;
  char *local_b0;
  undefined8 local_a8;
  AlphaNum local_80;
  string local_50;
  
  field = BeginNamed(this,name,true);
  if (field != (Field *)0x0) {
    bVar4 = ValidOneof(this,field,name);
    if (bVar4) {
      type = LookupType(this,field);
      if (type == (Type *)0x0) {
        this->invalid_depth_ = this->invalid_depth_ + 1;
        local_b0 = "Missing descriptor for field: ";
        local_a8 = 0x1e;
        psVar1 = (field->type_url_).ptr_;
        local_80.piece_data_ = (psVar1->_M_dataplus)._M_p;
        local_80.piece_size_ = psVar1->_M_string_length;
        StrCat_abi_cxx11_(&local_50,(protobuf *)&local_b0,&local_80,(AlphaNum *)local_80.piece_data_
                         );
        _Var3._M_p = local_50._M_dataplus._M_p;
        if ((long)local_50._M_string_length < 0) {
          StringPiece::LogFatalSizeTooBig(local_50._M_string_length,"size_t to int conversion");
        }
        pPVar2 = (this->element_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                 ._M_head_impl;
        if (pPVar2 == (ProtoElement *)0x0) {
          pLVar5 = (this->tracker_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                   .
                   super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                   ._M_head_impl;
        }
        else {
          pLVar5 = &pPVar2->super_LocationTrackerInterface;
        }
        (*this->listener_->_vptr_ErrorListener[2])
                  (this->listener_,pLVar5,name.ptr_,name.length_,_Var3._M_p,
                   local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      else {
        StartListField(this,field,type);
      }
    }
    else {
      this->invalid_depth_ = this->invalid_depth_ + 1;
    }
  }
  return this;
}

Assistant:

ProtoWriter* ProtoWriter::StartList(
    StringPiece name) {

  const google::protobuf::Field* field = BeginNamed(name, true);

  if (field == nullptr) return this;

  if (!ValidOneof(*field, name)) {
    ++invalid_depth_;
    return this;
  }

  const google::protobuf::Type* type = LookupType(field);
  if (type == nullptr) {
    ++invalid_depth_;
    InvalidName(name, StrCat("Missing descriptor for field: ",
                                   field->type_url()));
    return this;
  }

  return StartListField(*field, *type);
}